

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_signed.cpp
# Opt level: O2

bool sc_dt::operator<(long u,sc_signed *v)

{
  int iVar1;
  unsigned_long v_00;
  sc_digit ud [3];
  
  if (u < 1) {
    if (u == 0) {
      v_00 = 0;
      iVar1 = 0;
    }
    else {
      v_00 = -u;
      if ((ulong)u < 0x8000000000000001) {
        v_00 = 0x8000000000000000;
      }
      iVar1 = -1;
    }
  }
  else {
    iVar1 = 1;
    v_00 = u;
  }
  from_uint<unsigned_long>(3,ud,v_00);
  if (v->sgn <= iVar1) {
    if (iVar1 <= v->sgn) {
      if (iVar1 == -1) {
        iVar1 = vec_skip_and_cmp(3,ud,v->ndigits,v->digit);
        if (0 < iVar1) {
          return true;
        }
      }
      else if ((iVar1 == 1) && (iVar1 = vec_skip_and_cmp(3,ud,v->ndigits,v->digit), iVar1 < 0)) {
        return true;
      }
    }
    return false;
  }
  return true;
}

Assistant:

bool
operator<(long u, const sc_signed& v)
{
  CONVERT_LONG(u);

  if (us < v.sgn)
    return true;

  if (us > v.sgn)
    return false;

  // us == v.sgn

  if (us == SC_POS) {

    if (vec_skip_and_cmp(DIGITS_PER_LONG, ud, v.ndigits, v.digit) < 0)
      return true;

  }
  else if (us == SC_NEG) {

    if (vec_skip_and_cmp(DIGITS_PER_LONG, ud, v.ndigits, v.digit) > 0)
      return true;

  }

  return false;
}